

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O3

DdNode * Cudd_Dxygtdxz(DdManager *dd,int N,DdNode **x,DdNode **y,DdNode **z)

{
  int *piVar1;
  DdNode *g;
  bool bVar2;
  DdNode *g_00;
  DdNode *h;
  DdNode *g_01;
  DdNode *n;
  DdNode *g_02;
  DdNode *g_03;
  DdNode *h_00;
  ulong uVar3;
  long lVar4;
  long lVar5;
  
  g = dd->one;
  lVar4 = (long)N;
  g_00 = Cudd_bddIte(dd,y[lVar4 + -1],g,(DdNode *)((ulong)z[lVar4 + -1] ^ 1));
  if (g_00 != (DdNode *)0x0) {
    piVar1 = (int *)(((ulong)g_00 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    lVar4 = lVar4 + -1;
    h = Cudd_bddIte(dd,y[lVar4],z[lVar4],g);
    h_00 = g_00;
    if (h != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)h & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      g_01 = Cudd_bddIte(dd,x[lVar4],g_00,h);
      if (g_01 != (DdNode *)0x0) {
        uVar3 = (ulong)g_01 & 0xfffffffffffffffe;
        *(int *)(uVar3 + 4) = *(int *)(uVar3 + 4) + 1;
        Cudd_RecursiveDeref(dd,g_00);
        Cudd_RecursiveDeref(dd,h);
        if (1 < N) {
          lVar4 = (ulong)(N - 2) + 1;
          do {
            n = Cudd_bddIte(dd,z[lVar4 + -1],g,(DdNode *)((ulong)g_01 ^ 1));
            h_00 = g_01;
            if (n == (DdNode *)0x0) goto LAB_0078f7e7;
            piVar1 = (int *)(((ulong)n & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            g_00 = Cudd_bddIte(dd,z[lVar4 + -1],g_01,g);
            if (g_00 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,g_01);
              h_00 = n;
              goto LAB_0078f7e7;
            }
            piVar1 = (int *)(((ulong)g_00 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            h = Cudd_bddIte(dd,z[lVar4 + -1],g,g_01);
            if (h == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,g_01);
              Cudd_RecursiveDeref(dd,n);
              h_00 = g_00;
              goto LAB_0078f7e7;
            }
            piVar1 = (int *)(((ulong)h & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            g_02 = Cudd_bddIte(dd,z[lVar4 + -1],g_01,(DdNode *)((ulong)g ^ 1));
            if (g_02 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,g_01);
              Cudd_RecursiveDeref(dd,n);
              goto LAB_0078f6ff;
            }
            piVar1 = (int *)(((ulong)g_02 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            Cudd_RecursiveDeref(dd,g_01);
            g_03 = Cudd_bddIte(dd,y[lVar4 + -1],g_00,(DdNode *)((ulong)n ^ 1));
            if (g_03 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,n);
              Cudd_RecursiveDeref(dd,g_00);
              Cudd_RecursiveDeref(dd,h);
              h_00 = g_02;
              goto LAB_0078f7e7;
            }
            piVar1 = (int *)(((ulong)g_03 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            h_00 = Cudd_bddIte(dd,y[lVar4 + -1],g_02,h);
            if (h_00 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,n);
              Cudd_RecursiveDeref(dd,g_00);
              Cudd_RecursiveDeref(dd,h);
              g_00 = g_02;
              h = g_03;
              goto LAB_0078f6ff;
            }
            piVar1 = (int *)(((ulong)h_00 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            Cudd_RecursiveDeref(dd,n);
            Cudd_RecursiveDeref(dd,g_00);
            Cudd_RecursiveDeref(dd,h);
            Cudd_RecursiveDeref(dd,g_02);
            g_01 = Cudd_bddIte(dd,x[lVar4 + -1],g_03,h_00);
            if (g_01 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,g_03);
              goto LAB_0078f7e7;
            }
            uVar3 = (ulong)g_01 & 0xfffffffffffffffe;
            *(int *)(uVar3 + 4) = *(int *)(uVar3 + 4) + 1;
            Cudd_RecursiveDeref(dd,g_03);
            Cudd_RecursiveDeref(dd,h_00);
            lVar5 = lVar4 + -1;
            bVar2 = 0 < lVar4;
            lVar4 = lVar5;
          } while (lVar5 != 0 && bVar2);
        }
        *(int *)(uVar3 + 4) = *(int *)(uVar3 + 4) + -1;
        return (DdNode *)((ulong)g_01 ^ 1);
      }
LAB_0078f6ff:
      Cudd_RecursiveDeref(dd,g_00);
      h_00 = h;
    }
LAB_0078f7e7:
    Cudd_RecursiveDeref(dd,h_00);
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_Dxygtdxz(
  DdManager * dd /* DD manager */,
  int  N /* number of x, y, and z variables */,
  DdNode ** x /* array of x variables */,
  DdNode ** y /* array of y variables */,
  DdNode ** z /* array of z variables */)
{
    DdNode *one, *zero;
    DdNode *z1, *z2, *z3, *z4, *y1_, *y2, *x1;
    int     i;

    one = DD_ONE(dd);
    zero = Cudd_Not(one);

    /* Build bottom part of BDD outside loop. */
    y1_ = Cudd_bddIte(dd, y[N-1], one, Cudd_Not(z[N-1]));
    if (y1_ == NULL) return(NULL);
    cuddRef(y1_);
    y2 = Cudd_bddIte(dd, y[N-1], z[N-1], one);
    if (y2 == NULL) {
        Cudd_RecursiveDeref(dd, y1_);
        return(NULL);
    }
    cuddRef(y2);
    x1 = Cudd_bddIte(dd, x[N-1], y1_, y2);
    if (x1 == NULL) {
        Cudd_RecursiveDeref(dd, y1_);
        Cudd_RecursiveDeref(dd, y2);
        return(NULL);
    }
    cuddRef(x1);
    Cudd_RecursiveDeref(dd, y1_);
    Cudd_RecursiveDeref(dd, y2);

    /* Loop to build the rest of the BDD. */
    for (i = N-2; i >= 0; i--) {
        z1 = Cudd_bddIte(dd, z[i], one, Cudd_Not(x1));
        if (z1 == NULL) {
            Cudd_RecursiveDeref(dd, x1);
            return(NULL);
        }
        cuddRef(z1);
        z2 = Cudd_bddIte(dd, z[i], x1, one);
        if (z2 == NULL) {
            Cudd_RecursiveDeref(dd, x1);
            Cudd_RecursiveDeref(dd, z1);
            return(NULL);
        }
        cuddRef(z2);
        z3 = Cudd_bddIte(dd, z[i], one, x1);
        if (z3 == NULL) {
            Cudd_RecursiveDeref(dd, x1);
            Cudd_RecursiveDeref(dd, z1);
            Cudd_RecursiveDeref(dd, z2);
            return(NULL);
        }
        cuddRef(z3);
        z4 = Cudd_bddIte(dd, z[i], x1, zero);
        if (z4 == NULL) {
            Cudd_RecursiveDeref(dd, x1);
            Cudd_RecursiveDeref(dd, z1);
            Cudd_RecursiveDeref(dd, z2);
            Cudd_RecursiveDeref(dd, z3);
            return(NULL);
        }
        cuddRef(z4);
        Cudd_RecursiveDeref(dd, x1);
        y1_ = Cudd_bddIte(dd, y[i], z2, Cudd_Not(z1));
        if (y1_ == NULL) {
            Cudd_RecursiveDeref(dd, z1);
            Cudd_RecursiveDeref(dd, z2);
            Cudd_RecursiveDeref(dd, z3);
            Cudd_RecursiveDeref(dd, z4);
            return(NULL);
        }
        cuddRef(y1_);
        y2 = Cudd_bddIte(dd, y[i], z4, z3);
        if (y2 == NULL) {
            Cudd_RecursiveDeref(dd, z1);
            Cudd_RecursiveDeref(dd, z2);
            Cudd_RecursiveDeref(dd, z3);
            Cudd_RecursiveDeref(dd, z4);
            Cudd_RecursiveDeref(dd, y1_);
            return(NULL);
        }
        cuddRef(y2);
        Cudd_RecursiveDeref(dd, z1);
        Cudd_RecursiveDeref(dd, z2);
        Cudd_RecursiveDeref(dd, z3);
        Cudd_RecursiveDeref(dd, z4);
        x1 = Cudd_bddIte(dd, x[i], y1_, y2);
        if (x1 == NULL) {
            Cudd_RecursiveDeref(dd, y1_);
            Cudd_RecursiveDeref(dd, y2);
            return(NULL);
        }
        cuddRef(x1);
        Cudd_RecursiveDeref(dd, y1_);
        Cudd_RecursiveDeref(dd, y2);
    }
    cuddDeref(x1);
    return(Cudd_Not(x1));

}